

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void rw::MatFX::setEffects(Material *mat,uint32 type)

{
  uint32 uVar1;
  MatFX *matfx;
  uint uVar2;
  
  matfx = *(MatFX **)((long)&mat->texture + (long)DAT_0014a1fc);
  if (matfx == (MatFX *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/matfx.cpp line: 111"
    ;
    matfx = (MatFX *)(*DAT_00149da8)(0x58,0x30120);
    *(undefined8 *)matfx->fx = 0;
    matfx->fx[0].field_1.bump.frame = (Frame *)0x0;
    matfx->fx[0].field_1.bump.bumpedTex = (Texture *)0x0;
    matfx->fx[0].field_1.bump.tex = (Texture *)0x0;
    *(undefined8 *)((long)&matfx->fx[0].field_1 + 0x18) = 0;
    *(undefined8 *)(matfx->fx + 1) = 0;
    matfx->fx[1].field_1.bump.frame = (Frame *)0x0;
    matfx->fx[1].field_1.bump.bumpedTex = (Texture *)0x0;
    matfx->fx[1].field_1.bump.tex = (Texture *)0x0;
    *(undefined8 *)((long)&matfx->fx[1].field_1 + 0x18) = 0;
    *(undefined8 *)&matfx->type = 0;
    *(MatFX **)((long)&mat->texture + (long)DAT_0014a1fc) = matfx;
  }
  if (matfx->type != type && matfx->type != 0) {
    clearMatFX(matfx);
  }
  matfx->type = type;
  uVar2 = type - 1;
  if (uVar2 < 6) {
    uVar1 = *(uint32 *)(&DAT_00139768 + (ulong)uVar2 * 4);
    matfx->fx[0].type = *(uint32 *)(&DAT_00139750 + (ulong)uVar2 * 4);
    matfx->fx[1].type = uVar1;
  }
  return;
}

Assistant:

void
MatFX::setEffects(Material *mat, uint32 type)
{
	MatFX *matfx;

	matfx = MatFX::get(mat);
	if(matfx == nil){
		matfx = rwNewT(MatFX, 1, MEMDUR_EVENT | ID_MATFX);
		memset(matfx, 0, sizeof(MatFX));
		*PLUGINOFFSET(MatFX*, mat, matFXGlobals.materialOffset) = matfx;
	}

	if(matfx->type != 0 && matfx->type != type)
		clearMatFX(matfx);
	matfx->type = type;
	switch(type){
	case BUMPMAP:
	case ENVMAP:
	case DUAL:
	case UVTRANSFORM:
		matfx->fx[0].type = type;
		matfx->fx[1].type = NOTHING;
		break;

	case BUMPENVMAP:
		matfx->fx[0].type = BUMPMAP;
		matfx->fx[1].type = ENVMAP;
		break;

	case DUALUVTRANSFORM:
		matfx->fx[0].type = UVTRANSFORM;
		matfx->fx[1].type = DUAL;
		break;
	}
}